

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Execute<duckdb::string_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *state,string_t x_data,
               hugeint_t y_data,AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  string_t new_value;
  
  lVar6 = y_data.upper;
  uVar4 = y_data.lower;
  new_value.value._0_8_ = x_data.value._8_8_;
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar5 = uVar4;
  if ((puVar1 != (unsigned_long *)0x0) &&
     (uVar5 = binary->ridx, (puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0)) {
    return;
  }
  lVar2 = (state->value).upper;
  bVar7 = (state->value).lower < uVar4;
  bVar3 = bVar7;
  if ((lVar6 <= lVar2) && (bVar3 = bVar7 && lVar2 == lVar6, !bVar7 || lVar2 != lVar6)) {
    return;
  }
  uVar5 = CONCAT71((int7)(uVar5 >> 8),bVar3);
  puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    (state->super_ArgMinMaxStateBase).arg_null = false;
  }
  else {
    uVar5 = binary->lidx;
    bVar3 = (puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0;
    (state->super_ArgMinMaxStateBase).arg_null = bVar3;
    if (bVar3) goto LAB_00dca57b;
  }
  new_value.value.pointer.ptr = (char *)uVar5;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)&state->arg,x_data.value._0_8_,new_value);
LAB_00dca57b:
  (state->value).lower = uVar4;
  (state->value).upper = lVar6;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}